

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sslexeme.cpp
# Opt level: O0

int IsStringFloat(char *str)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  int local_28;
  int local_24;
  int i_2;
  int i_1;
  int isRadixPointFound;
  int i;
  char *str_local;
  
  if (str == (char *)0x0) {
    str_local._4_4_ = 0;
  }
  else {
    sVar3 = strlen(str);
    if (sVar3 == 0) {
      str_local._4_4_ = 0;
    }
    else {
      for (i_1 = 0; sVar3 = strlen(str), (ulong)(long)i_1 < sVar3; i_1 = i_1 + 1) {
        iVar2 = IsCharNumeric(str[i_1]);
        if (((iVar2 == 0) && (str[i_1] != '-')) && (str[i_1] != '.')) {
          return 0;
        }
      }
      bVar1 = false;
      for (local_24 = 0; sVar3 = strlen(str), (ulong)(long)local_24 < sVar3; local_24 = local_24 + 1
          ) {
        if (str[local_24] == '.') {
          if (bVar1) {
            return 0;
          }
          bVar1 = true;
        }
      }
      for (local_28 = 1; sVar3 = strlen(str), (ulong)(long)local_28 < sVar3; local_28 = local_28 + 1
          ) {
        if (str[local_28] == '-') {
          return 0;
        }
      }
      if (bVar1) {
        str_local._4_4_ = 1;
      }
      else {
        str_local._4_4_ = 0;
      }
    }
  }
  return str_local._4_4_;
}

Assistant:

int IsStringFloat(const char* str)
{
    if (!str)
        return FALSE;

    if (strlen(str) == 0)
        return FALSE;

    for (int i = 0; i < strlen(str); i++)
    {
        if (!IsCharNumeric(str[i]) && str[i] != '-' && str[i] != '.')
            return FALSE;
    }

    int isRadixPointFound = 0;
    for (int i = 0; i < strlen(str); i++)
    {
        if (str[i] == '.')
        {
            if (isRadixPointFound)
                return FALSE;
            else
                isRadixPointFound = 1;
        }
    }

    for (int i = 1; i < strlen(str); i++)
    {
        if (str[i] == '-')
            return FALSE;
    }

    if (isRadixPointFound)
        return TRUE;
    else
        return FALSE;
}